

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

void __thiscall
QSequentialAnimationGroup::QSequentialAnimationGroup
          (QSequentialAnimationGroup *this,QObject *parent)

{
  QSequentialAnimationGroupPrivate *this_00;
  
  this_00 = (QSequentialAnimationGroupPrivate *)operator_new(0xe8);
  QSequentialAnimationGroupPrivate::QSequentialAnimationGroupPrivate(this_00);
  QAnimationGroup::QAnimationGroup((QAnimationGroup *)this,(QAnimationGroupPrivate *)this_00,parent)
  ;
  *(undefined ***)this = &PTR_metaObject_00668798;
  return;
}

Assistant:

QSequentialAnimationGroup::QSequentialAnimationGroup(QObject *parent)
    : QAnimationGroup(*new QSequentialAnimationGroupPrivate, parent)
{
}